

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::CanonicalIterator::getEquivalents
          (CanonicalIterator *this,UnicodeString *segment,int32_t *result_len,UErrorCode *status)

{
  int iVar1;
  UnicodeString *src;
  int *piVar2;
  UBool UVar3;
  int32_t iVar4;
  UHashElement *pUVar5;
  UnicodeString *pUVar6;
  long *plVar7;
  long lVar8;
  int32_t *pos;
  UMemory *this_00;
  long lVar9;
  int32_t el;
  UErrorCode local_430;
  int32_t el2;
  UnicodeString *local_428;
  Char16Ptr local_420;
  int *local_418;
  UChar *local_410;
  Hashtable permutations;
  Hashtable result;
  Hashtable basic;
  UnicodeString attempt;
  UnicodeString item;
  UnicodeString possible;
  UChar USeg [256];
  
  local_428 = segment;
  Hashtable::Hashtable(&result,status);
  Hashtable::Hashtable(&permutations,status);
  Hashtable::Hashtable(&basic,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uhash_setValueDeleter_63(result.hash,uprv_deleteUObject_63);
    uhash_setValueDeleter_63(permutations.hash,uprv_deleteUObject_63);
    uhash_setValueDeleter_63(basic.hash,uprv_deleteUObject_63);
    local_420.p_ = USeg;
    iVar4 = UnicodeString::extract(local_428,&local_420,0x100,status);
    local_410 = local_420.p_;
    getEquivalents2(this,&basic,USeg,iVar4,status);
    pos = &el;
    el = -1;
    local_418 = result_len;
    pUVar5 = uhash_nextElement_63(basic.hash,pos);
    local_430 = U_ILLEGAL_ARGUMENT_ERROR;
    while (pUVar5 != (UHashElement *)0x0) {
      UnicodeString::UnicodeString(&item,(UnicodeString *)(pUVar5->value).pointer);
      uhash_removeAll_63(permutations.hash);
      permute(&item,'\x01',&permutations,status);
      el2 = -1;
      pUVar5 = uhash_nextElement_63(permutations.hash,&el2);
      while (pUVar5 != (UHashElement *)0x0) {
        UnicodeString::UnicodeString(&possible,(UnicodeString *)(pUVar5->value).pointer);
        attempt.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003a7268;
        attempt.fUnion.fStackFields.fLengthAndFlags = 2;
        (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,&possible,&attempt,status);
        pUVar6 = local_428;
        UVar3 = UnicodeString::operator==(&attempt,local_428);
        if (UVar3 != '\0') {
          pUVar6 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar6);
          if (pUVar6 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString(pUVar6,&possible);
          }
          Hashtable::put(&result,&possible,pUVar6,status);
        }
        pUVar5 = uhash_nextElement_63(permutations.hash,&el2);
        UnicodeString::~UnicodeString(&attempt);
        UnicodeString::~UnicodeString(&possible);
      }
      pos = &el;
      pUVar5 = uhash_nextElement_63(basic.hash,pos);
      UnicodeString::~UnicodeString(&item);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar4 = uhash_count_63(result.hash);
      piVar2 = local_418;
      if (iVar4 != 0) {
        lVar9 = (long)iVar4 * 0x40;
        this_00 = (UMemory *)0xffffffffffffffff;
        if (-1 < iVar4) {
          this_00 = (UMemory *)(lVar9 + 8);
        }
        plVar7 = (long *)UMemory::operator_new__(this_00,(size_t)pos);
        if (plVar7 != (long *)0x0) {
          *plVar7 = (long)iVar4;
          pUVar6 = (UnicodeString *)(plVar7 + 1);
          lVar8 = 0;
          do {
            *(undefined ***)((long)plVar7 + lVar8 + 8) = &PTR__UnicodeString_003a7268;
            *(undefined2 *)((long)plVar7 + lVar8 + 0x10) = 2;
            lVar8 = lVar8 + 0x40;
          } while (lVar9 != lVar8);
          *piVar2 = 0;
          el = -1;
          pUVar5 = uhash_nextElement_63(result.hash,&el);
          while (pUVar5 != (UHashElement *)0x0) {
            src = (UnicodeString *)(pUVar5->value).pointer;
            iVar1 = *piVar2;
            *piVar2 = iVar1 + 1;
            UnicodeString::operator=(pUVar6 + iVar1,src);
            pUVar5 = uhash_nextElement_63(result.hash,&el);
          }
          goto LAB_00270964;
        }
        local_430 = U_MEMORY_ALLOCATION_ERROR;
      }
      *status = local_430;
    }
  }
  pUVar6 = (UnicodeString *)0x0;
LAB_00270964:
  Hashtable::~Hashtable(&basic);
  Hashtable::~Hashtable(&permutations);
  Hashtable::~Hashtable(&result);
  return pUVar6;
}

Assistant:

UnicodeString* CanonicalIterator::getEquivalents(const UnicodeString &segment, int32_t &result_len, UErrorCode &status) {
    Hashtable result(status);
    Hashtable permutations(status);
    Hashtable basic(status);
    if (U_FAILURE(status)) {
        return 0;
    }
    result.setValueDeleter(uprv_deleteUObject);
    permutations.setValueDeleter(uprv_deleteUObject);
    basic.setValueDeleter(uprv_deleteUObject);

    UChar USeg[256];
    int32_t segLen = segment.extract(USeg, 256, status);
    getEquivalents2(&basic, USeg, segLen, status);

    // now get all the permutations
    // add only the ones that are canonically equivalent
    // TODO: optimize by not permuting any class zero.

    const UHashElement *ne = NULL;
    int32_t el = UHASH_FIRST;
    //Iterator it = basic.iterator();
    ne = basic.nextElement(el);
    //while (it.hasNext())
    while (ne != NULL) {
        //String item = (String) it.next();
        UnicodeString item = *((UnicodeString *)(ne->value.pointer));

        permutations.removeAll();
        permute(item, CANITER_SKIP_ZEROES, &permutations, status);
        const UHashElement *ne2 = NULL;
        int32_t el2 = UHASH_FIRST;
        //Iterator it2 = permutations.iterator();
        ne2 = permutations.nextElement(el2);
        //while (it2.hasNext())
        while (ne2 != NULL) {
            //String possible = (String) it2.next();
            //UnicodeString *possible = new UnicodeString(*((UnicodeString *)(ne2->value.pointer)));
            UnicodeString possible(*((UnicodeString *)(ne2->value.pointer)));
            UnicodeString attempt;
            nfd.normalize(possible, attempt, status);

            // TODO: check if operator == is semanticaly the same as attempt.equals(segment)
            if (attempt==segment) {
                //if (PROGRESS) printf("Adding Permutation: %s\n", UToS(Tr(*possible)));
                // TODO: use the hashtable just to catch duplicates - store strings directly (somehow).
                result.put(possible, new UnicodeString(possible), status); //add(possible);
            } else {
                //if (PROGRESS) printf("-Skipping Permutation: %s\n", UToS(Tr(*possible)));
            }

            ne2 = permutations.nextElement(el2);
        }
        ne = basic.nextElement(el);
    }

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0;
    }
    // convert into a String[] to clean up storage
    //String[] finalResult = new String[result.size()];
    UnicodeString *finalResult = NULL;
    int32_t resultCount;
    if((resultCount = result.count()) != 0) {
        finalResult = new UnicodeString[resultCount];
        if (finalResult == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
    }
    else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    //result.toArray(finalResult);
    result_len = 0;
    el = UHASH_FIRST;
    ne = result.nextElement(el);
    while(ne != NULL) {
        finalResult[result_len++] = *((UnicodeString *)(ne->value.pointer));
        ne = result.nextElement(el);
    }


    return finalResult;
}